

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consuming_buffers.hpp
# Opt level: O0

array<asio::const_buffer,_2UL> * __thiscall
asio::detail::
consuming_buffers<asio::const_buffer,_std::array<asio::const_buffer,_2UL>,_const_asio::const_buffer_*>
::prepare(consuming_buffers<asio::const_buffer,_std::array<asio::const_buffer,_2UL>,_const_asio::const_buffer_*>
          *this,size_t max_size)

{
  reference pvVar1;
  size_t sVar2;
  size_type in_RDX;
  size_t in_RSI;
  const_buffer *in_RDI;
  const_buffers_1 cVar3;
  array<asio::const_buffer,_2UL> *result;
  size_t buffer0_size;
  size_type in_stack_ffffffffffffff78;
  array<asio::const_buffer,_2UL> *in_stack_ffffffffffffff80;
  array<asio::const_buffer,_2UL> *this_00;
  const_buffer *b;
  const_buffer *in_stack_ffffffffffffffa0;
  void *local_48;
  size_t local_40;
  void *local_28;
  size_t local_20;
  
  b = in_RDI;
  pvVar1 = std::array<asio::const_buffer,_2UL>::operator[]
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ((const_buffer *)&b->data_)->data_ = pvVar1->data_;
  b->size_ = pvVar1->size_;
  pvVar1 = std::array<asio::const_buffer,_2UL>::operator[]
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  b[1].data_ = pvVar1->data_;
  b[1].size_ = pvVar1->size_;
  pvVar1 = std::array<asio::const_buffer,_2UL>::operator[]
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar2 = const_buffer::size(pvVar1);
  std::array<asio::const_buffer,_2UL>::operator[]
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  asio::operator+(in_stack_ffffffffffffffa0,in_RSI);
  cVar3 = asio::buffer(b,(size_t)in_RDI);
  pvVar1 = std::array<asio::const_buffer,_2UL>::operator[]
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_28 = cVar3.super_const_buffer.data_;
  pvVar1->data_ = local_28;
  local_20 = cVar3.super_const_buffer.size_;
  pvVar1->size_ = local_20;
  pvVar1 = std::array<asio::const_buffer,_2UL>::operator[]
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (*(ulong *)(in_RSI + 0x20) < sVar2) {
    this_00 = (array<asio::const_buffer,_2UL> *)0x0;
  }
  else {
    this_00 = (array<asio::const_buffer,_2UL> *)(*(long *)(in_RSI + 0x20) - sVar2);
  }
  asio::operator+(pvVar1,in_RSI);
  pvVar1 = std::array<asio::const_buffer,_2UL>::operator[](this_00,in_RDX);
  const_buffer::size(pvVar1);
  cVar3 = asio::buffer(b,(size_t)in_RDI);
  pvVar1 = std::array<asio::const_buffer,_2UL>::operator[](this_00,in_RDX);
  local_48 = cVar3.super_const_buffer.data_;
  pvVar1->data_ = local_48;
  local_40 = cVar3.super_const_buffer.size_;
  pvVar1->size_ = local_40;
  return (array<asio::const_buffer,_2UL> *)in_RDI;
}

Assistant:

std::array<Buffer, 2> prepare(std::size_t max_size)
  {
    std::array<Buffer, 2> result = {{
      Buffer(buffers_[0]), Buffer(buffers_[1]) }};
    std::size_t buffer0_size = result[0].size();
    result[0] = asio::buffer(result[0] + total_consumed_, max_size);
    result[1] = asio::buffer(
        result[1] + (total_consumed_ < buffer0_size
          ? 0 : total_consumed_ - buffer0_size),
        max_size - result[0].size());
    return result;
  }